

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-bind.h
# Opt level: O0

void __thiscall
dynamicgraph::command::CommandVoid1<dynamicgraph::CustomEntity,_int>::CommandVoid1
          (CommandVoid1<dynamicgraph::CustomEntity,_int> *this,CustomEntity *entity,
          function_t *function,string *docString)

{
  generic_list<dynamicgraph::command::Value::Type> local_90;
  vector<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
  local_40;
  string *local_28;
  string *docString_local;
  function_t *function_local;
  CustomEntity *entity_local;
  CommandVoid1<dynamicgraph::CustomEntity,_int> *this_local;
  
  local_28 = docString;
  docString_local = (string *)function;
  function_local = (function_t *)entity;
  entity_local = (CustomEntity *)this;
  boost::assign::list_of<dynamicgraph::command::Value::Type_const&>
            (&local_90,(assign *)&ValueHelper<int>::TypeID,(Type *)function);
  boost::assign_detail::generic_list::operator_cast_to_vector(&local_40,(generic_list *)&local_90);
  dynamicgraph::command::Command::Command
            (&this->super_Command,&entity->super_Entity,(vector *)&local_40,(string *)local_28);
  std::
  vector<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>::
  ~vector(&local_40);
  boost::assign_detail::generic_list<dynamicgraph::command::Value::Type>::~generic_list(&local_90);
  *(undefined ***)this = &PTR__CommandVoid1_0014b9e8;
  boost::function<void_(const_int_&)>::function(&this->fptr,function);
  return;
}

Assistant:

CommandVoid1(E &entity, function_t function, const std::string &docString)
      : Command(entity, boost::assign::list_of(ValueHelper<T>::TypeID),
                docString),
        fptr(function) {}